

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLNodeHandlerTextArea.cpp
# Opt level: O0

bool __thiscall
Rml::XMLNodeHandlerTextArea::ElementData
          (XMLNodeHandlerTextArea *this,XMLParser *parser,String *data,XMLDataType param_3)

{
  ParseFrame *pPVar1;
  SystemInterface *pSVar2;
  string local_50 [8];
  String translated_data;
  ElementFormControlTextArea *text_area;
  XMLDataType param_3_local;
  String *data_local;
  XMLParser *parser_local;
  XMLNodeHandlerTextArea *this_local;
  
  pPVar1 = XMLParser::GetParseFrame(parser);
  translated_data.field_2._8_8_ =
       rmlui_dynamic_cast<Rml::ElementFormControlTextArea*,Rml::Element*>(pPVar1->element);
  if ((ElementFormControlTextArea *)translated_data.field_2._8_8_ !=
      (ElementFormControlTextArea *)0x0) {
    ::std::__cxx11::string::string(local_50);
    pSVar2 = GetSystemInterface();
    (*pSVar2->_vptr_SystemInterface[3])(pSVar2,local_50,data);
    (**(code **)(*(long *)translated_data.field_2._8_8_ + 200))
              (translated_data.field_2._8_8_,local_50);
    ::std::__cxx11::string::~string(local_50);
  }
  return true;
}

Assistant:

bool XMLNodeHandlerTextArea::ElementData(XMLParser* parser, const String& data, XMLDataType /*type*/)
{
	ElementFormControlTextArea* text_area = rmlui_dynamic_cast<ElementFormControlTextArea*>(parser->GetParseFrame()->element);
	if (text_area != nullptr)
	{
		// Do any necessary translation.
		String translated_data;
		GetSystemInterface()->TranslateString(translated_data, data);

		text_area->SetValue(translated_data);
	}

	return true;
}